

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O0

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::socket_acceptor(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
                  *this,service *srv,string *ip,int port,int backlog)

{
  undefined4 uVar1;
  io_service *piVar2;
  int in_ECX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  endpoint ep;
  acceptor *in_stack_ffffffffffffff90;
  undefined8 *puVar3;
  endpoint local_38 [28];
  int local_1c;
  undefined8 local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  acceptor::acceptor(in_stack_ffffffffffffff90);
  *in_RDI = &PTR_async_accept_005309b8;
  in_RDI[1] = local_10;
  std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)0x49401a);
  piVar2 = cppcms::service::get_io_service((service *)0x494034);
  booster::aio::acceptor::acceptor((acceptor *)(in_RDI + 5),piVar2);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0x59) = 1;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
  booster::aio::endpoint::endpoint(local_38,in_RDX,local_1c);
  puVar3 = in_RDI + 5;
  uVar1 = booster::aio::endpoint::family();
  booster::aio::acceptor::open(puVar3,uVar1);
  booster::aio::basic_socket::set_option(in_RDI + 5,2,1);
  booster::aio::acceptor::bind((endpoint *)(in_RDI + 5));
  booster::aio::acceptor::listen((int)in_RDI + 0x28);
  booster::aio::endpoint::~endpoint(local_38);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,std::string ip,int port,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(true),
				sndbuf_(-1),
				rcvbuf_(-1)
			{
				io::endpoint ep(ip,port);
				acceptor_.open(ep.family());
                #ifndef CPPCMS_WIN32
				acceptor_.set_option(io::basic_socket::reuse_address,true);
                #endif
				acceptor_.bind(ep);
				acceptor_.listen(backlog);
			}